

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

SharedPtr<deqp::egl::GLES2ThreadTest::Surface> __thiscall
deqp::egl::GLES2ThreadTest::EGLResourceManager::popSurface(EGLResourceManager *this,int index)

{
  reference other;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> SVar1;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>_>
  local_38;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_1d;
  int local_1c;
  long lStack_18;
  int index_local;
  EGLResourceManager *this_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface;
  
  lStack_18 = CONCAT44(in_register_00000034,index);
  local_1d = 0;
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
             *)(lStack_18 + 0x18);
  local_1c = in_EDX;
  this_local = this;
  other = std::
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
          ::operator[](this_00,(long)in_EDX);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)this,other);
  local_38._M_current =
       (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)
       std::
       vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
       ::begin(this_00);
  local_30 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>_>
             ::operator+(&local_38,(long)local_1c);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>>>>
  ::__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>*>
            ((__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>>>>
              *)&local_28,&local_30);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
  ::erase(this_00,local_28);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (Surface *)this;
  return SVar1;
}

Assistant:

SharedPtr<Surface> EGLResourceManager::popSurface (int index)
{
	SharedPtr<Surface> surface = m_surfaces[index];
	m_surfaces.erase(m_surfaces.begin() + index);
	return surface;
}